

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structs.c
# Opt level: O0

ulp_private_key * ulp_alloc_private_key(size_t n,size_t l)

{
  uint64_t *puVar1;
  size_t in_RSI;
  size_t in_RDI;
  ulp_private_key *key;
  ulp_private_key *local_8;
  
  local_8 = (ulp_private_key *)malloc(0x20);
  if (local_8 == (ulp_private_key *)0x0) {
    local_8 = (ulp_private_key *)0x0;
  }
  else {
    local_8->n = in_RDI;
    local_8->l = in_RSI;
    puVar1 = (uint64_t *)malloc(in_RSI * in_RDI * 8);
    local_8->S = puVar1;
    if (local_8->S == (uint64_t *)0x0) {
      free(local_8);
      local_8 = (ulp_private_key *)0x0;
    }
  }
  return local_8;
}

Assistant:

ulp_private_key* ulp_alloc_private_key(size_t n, size_t l) {
    ulp_private_key* key = malloc(sizeof(ulp_private_key));
    if(key == NULL)
        return NULL;
    key->n = n;
    key->l = l;
    key->S = malloc(l*n*sizeof(key->q));
    if(key->S == NULL) {
        free(key);
        return NULL;
    }
    return key;
}